

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13b32::testTiledImage
               (Box2i *dataWindow,string *fileName,LevelMode levelMode,
               LevelRoundingMode levelRoundingMode)

{
  ostream *poVar1;
  int in_ECX;
  LevelRoundingMode in_EDX;
  string *in_RSI;
  int *in_RDI;
  DeepImage img2;
  Rand48 random;
  DeepImage img1;
  unsigned_long in_stack_fffffffffffffe18;
  Rand48 *in_stack_fffffffffffffe20;
  DeepImage *img;
  allocator<char> *__a;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  DeepImage local_198 [40];
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  DeepImage *in_stack_fffffffffffffe98;
  DeepImage *in_stack_fffffffffffffea0;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  DeepImage local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [3];
  int local_18;
  LevelRoundingMode local_14;
  string *local_10;
  int *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"tiles, data window = (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  pcVar2 = ", ";
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[1]);
  poVar1 = std::operator<<(poVar1,") - (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[2]);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[3]);
  poVar1 = std::operator<<(poVar1,"), level mode = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  poVar1 = std::operator<<(poVar1,", rounding mode = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this = local_80;
  Imf_3_2::DeepImage::DeepImage((DeepImage *)this);
  Imf_3_2::Image::resize((Box *)this,(LevelMode)local_8,local_14);
  __a = &local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,pcVar2,__a);
  Imf_3_2::Image::insertChannel((string *)local_80,(PixelType)local_b0,1,1,true);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  img = &local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,pcVar2,__a);
  Imf_3_2::Image::insertChannel((string *)local_80,(PixelType)local_d8,1,1,true);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,pcVar2,__a);
  Imf_3_2::Image::insertChannel((string *)local_80,(PixelType)local_100,2,1,true);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,pcVar2,__a);
  Imf_3_2::Image::insertChannel((string *)local_80,(PixelType)local_128,0,1,true);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  Imath_3_2::Rand48::Rand48(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  poVar1 = std::operator<<((ostream *)&std::cout,"    generating random pixel values");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  fillChannels((Rand48 *)__a,img);
  poVar1 = std::operator<<((ostream *)&std::cout,"    saving file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_3_2::saveDeepTiledImage(local_10,(DeepImage *)local_80);
  Imf_3_2::DeepImage::DeepImage(local_198);
  poVar1 = std::operator<<((ostream *)&std::cout,"    loading file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_3_2::loadDeepImage(local_10,local_198);
  poVar1 = std::operator<<((ostream *)&std::cout,"    comparing");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  verifyImagesAreEqual
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
             in_stack_fffffffffffffe90);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  Imf_3_2::DeepImage::~DeepImage(local_198);
  Imf_3_2::DeepImage::~DeepImage((DeepImage *)local_80);
  return;
}

Assistant:

void
testTiledImage (
    const Box2i&      dataWindow,
    const string&     fileName,
    LevelMode         levelMode,
    LevelRoundingMode levelRoundingMode)
{
    cout << "tiles, data window = "
            "("
         << dataWindow.min.x << ", " << dataWindow.min.y
         << ") - "
            "("
         << dataWindow.max.x << ", " << dataWindow.max.y
         << "), "
            "level mode = "
         << levelMode
         << ", "
            "rounding mode = "
         << levelRoundingMode << endl;

    FlatImage img1;
    img1.resize (dataWindow, levelMode, levelRoundingMode);

    img1.insertChannel ("H1", HALF, 1, 1, false);
    img1.insertChannel ("H2", HALF, 1, 1, true);
    img1.insertChannel ("F", FLOAT, 1, 1, false);
    img1.insertChannel ("UI", UINT, 1, 1, false);

    Rand48 random (0);
    cout << "    generating random pixel values" << endl;
    fillChannels (random, img1);

    cout << "    saving file" << endl;
    saveFlatTiledImage (fileName, img1);

    FlatImage img2;

    cout << "    loading file" << endl;
    loadFlatImage (fileName, img2);

    cout << "    comparing" << endl;
    verifyImagesAreEqual (img1, img2);

    remove (fileName.c_str ());
}